

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O0

void sanitize_player_loc(chunk *c,player *p)

{
  loc_conflict lVar1;
  loc_conflict grid;
  loc_conflict grid_00;
  _Bool _Var2;
  uint32_t uVar3;
  uint32_t uVar4;
  wchar_t wVar5;
  int local_34;
  wchar_t wStack_30;
  wchar_t try;
  loc_conflict vgrid;
  loc_conflict igrid;
  loc_conflict tgrid;
  player *p_local;
  chunk *c_local;
  
  _wStack_30 = (loc_conflict)loc(1,1);
  local_34 = 1000;
  lVar1.x = (p->grid).x;
  lVar1.y = (p->grid).y;
  _Var2 = square_in_bounds_fully(c,lVar1);
  if (((_Var2) &&
      (grid.x = (p->grid).x, grid.y = (p->grid).y, _Var2 = square_isarrivable(c,grid), _Var2)) &&
     (grid_00.x = (p->grid).x, grid_00.y = (p->grid).y, _Var2 = square_isvault(c,grid_00), !_Var2))
  {
    return;
  }
  do {
    lVar1 = igrid;
    if (local_34 == 0) {
      while( true ) {
        _Var2 = square_isempty(c,igrid);
        if (_Var2) {
          _Var2 = square_isvault(c,igrid);
          if (!_Var2) {
            (p->grid).x = igrid.x;
            (p->grid).y = igrid.y;
            return;
          }
          _wStack_30 = igrid;
        }
        _Var2 = loc_eq((loc)igrid,(loc)lVar1);
        if (_Var2) break;
        wVar5 = igrid.x + L'\x01';
        igrid.x = wVar5;
        if ((c->width + L'\xffffffff' <= wVar5) &&
           (igrid.y = igrid.y + L'\x01', igrid.x = L'\x01', c->height + L'\xffffffff' <= igrid.y)) {
          igrid.x = L'\x01';
          igrid.y = L'\x01';
        }
      }
      (p->grid).x = wStack_30;
      (p->grid).y = try;
      return;
    }
    local_34 = local_34 + -1;
    uVar3 = Rand_div(c->width + L'\xffffffff');
    uVar4 = Rand_div(c->height + L'\xffffffff');
    igrid = (loc_conflict)loc(uVar3 + 1,uVar4 + 1);
    _Var2 = square_isempty(c,igrid);
  } while ((!_Var2) || (_Var2 = square_isvault(c,igrid), _Var2));
  (p->grid).x = igrid.x;
  (p->grid).y = igrid.y;
  return;
}

Assistant:

static void sanitize_player_loc(struct chunk *c, struct player *p)
{
	struct loc tgrid, igrid, vgrid = loc(1, 1);
	int try = 1000;

	/* TODO potential problem: stairs in vaults? */

	/* Allow direct transfer if target location is teleportable */
	if (square_in_bounds_fully(c, p->grid)
		&& square_isarrivable(c, p->grid)
		&& !square_isvault(c, p->grid)) {
		return;
	}
	/* TODO should use something similar to teleport code, but this will
	 *  do for now as a quick'n dirty fix
	 */
	/* A bunch of random locations */
	while (try) {
		try = try - 1;
		tgrid = loc(randint0(c->width - 1) + 1, randint0(c->height - 1) + 1);
		if (square_isempty(c, tgrid) && !square_isvault(c, tgrid)) {
			p->grid = tgrid;
			return;
		}
	}

	/* That didnt work, use our last try as an intital grid... */
	igrid = tgrid;

	/* ...and do a full loop through the dungeon */
	while (1) {
		if (square_isempty(c, tgrid)) {
			if (!square_isvault(c, tgrid)) {
				/* OK location */
				p->grid = tgrid;
				return;
			}
			/* Vault, but lets remember it just in case */
			vgrid = tgrid;
		}
		/* Oops tried *every* tile... */
		if (loc_eq(tgrid, igrid)) {
			break;
		}
		tgrid.x++;
		if (tgrid.x >= c->width - 1) {
			tgrid.x = 1;
			tgrid.y++;
			if (tgrid.y >= c->height - 1) {
				tgrid.y = 1;
			}
		}
	}

	/* Fallback vault location (or at least a non-crashy square) */
	p->grid = vgrid;
}